

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_set_background_fixed
               (png_structrp png_ptr,png_const_color_16p background_color,int background_gamma_code,
               int need_expand,png_fixed_point background_gamma)

{
  undefined1 uVar1;
  png_uint_16 pVar2;
  png_uint_16 pVar3;
  png_uint_16 pVar4;
  int iVar5;
  png_fixed_point background_gamma_local;
  int need_expand_local;
  int background_gamma_code_local;
  png_const_color_16p background_color_local;
  png_structrp png_ptr_local;
  
  iVar5 = png_rtran_ok(png_ptr,0);
  if ((iVar5 != 0) && (background_color != (png_const_color_16p)0x0)) {
    if (background_gamma_code == 0) {
      png_warning(png_ptr,"Application must supply a known background gamma");
    }
    else {
      png_ptr->transformations = png_ptr->transformations | 0x40080;
      png_ptr->transformations = png_ptr->transformations & 0xff7fffff;
      png_ptr->flags = png_ptr->flags & 0xffffdfff;
      uVar1 = background_color->field_0x1;
      pVar2 = background_color->red;
      pVar3 = background_color->green;
      pVar4 = background_color->blue;
      (png_ptr->background).index = background_color->index;
      (png_ptr->background).field_0x1 = uVar1;
      (png_ptr->background).red = pVar2;
      (png_ptr->background).green = pVar3;
      (png_ptr->background).blue = pVar4;
      (png_ptr->background).gray = background_color->gray;
      png_ptr->background_gamma = background_gamma;
      png_ptr->background_gamma_type = (png_byte)background_gamma_code;
      if (need_expand == 0) {
        png_ptr->transformations = png_ptr->transformations & 0xfffffeff;
      }
      else {
        png_ptr->transformations = png_ptr->transformations | 0x100;
      }
    }
  }
  return;
}

Assistant:

void PNGFAPI
png_set_background_fixed(png_structrp png_ptr,
    png_const_color_16p background_color, int background_gamma_code,
    int need_expand, png_fixed_point background_gamma)
{
   png_debug(1, "in png_set_background_fixed");

   if (png_rtran_ok(png_ptr, 0) == 0 || background_color == NULL)
      return;

   if (background_gamma_code == PNG_BACKGROUND_GAMMA_UNKNOWN)
   {
      png_warning(png_ptr, "Application must supply a known background gamma");
      return;
   }

   png_ptr->transformations |= PNG_COMPOSE | PNG_STRIP_ALPHA;
   png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
   png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;

   png_ptr->background = *background_color;
   png_ptr->background_gamma = background_gamma;
   png_ptr->background_gamma_type = (png_byte)(background_gamma_code);
   if (need_expand != 0)
      png_ptr->transformations |= PNG_BACKGROUND_EXPAND;
   else
      png_ptr->transformations &= ~PNG_BACKGROUND_EXPAND;
}